

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::upresV(PtexSeparableKernel *this)

{
  int8_t *piVar1;
  int iVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  
  iVar2 = this->vw;
  uVar4 = iVar2 * 2;
  if (0 < (long)iVar2) {
    pfVar3 = this->kv;
    uVar5 = iVar2 + 1;
    lVar6 = 0;
    do {
      fVar7 = *(float *)((long)pfVar3 + lVar6 + (long)iVar2 * 4 + -4) * 0.5;
      *(float *)((long)pfVar3 + lVar6 * 2 + (ulong)uVar4 * 4 + -4) = fVar7;
      *(float *)((long)pfVar3 + lVar6 * 2 + (ulong)uVar4 * 4 + -8) = fVar7;
      uVar5 = uVar5 - 1;
      lVar6 = lVar6 + -4;
    } while (1 < uVar5);
  }
  this->vw = uVar4;
  this->v = this->v << 1;
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + '\x01';
  return;
}

Assistant:

void upresV()
    {
        float* src = kv + vw-1;
        float* dst = kv + vw*2-2;
        for (int i = vw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        vw *= 2;
        v *= 2;
        res.vlog2++;
    }